

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Light.cpp
# Opt level: O3

void __thiscall OpenMD::Perturbations::Light::initialize(Light *this)

{
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  undefined8 *puVar1;
  pointer pdVar2;
  bool bVar3;
  pointer pcVar4;
  undefined8 uVar5;
  uint i;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  iterator iVar8;
  pointer pcVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  LightParameters *pLVar13;
  ulong uVar14;
  undefined8 unaff_R12;
  ulong uVar15;
  byte bVar16;
  double tmp;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double tmp_1;
  double dVar20;
  vector<double,_std::allocator<double>_> k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  stringToPolarization;
  undefined1 local_d8 [72];
  double local_90;
  uint local_84;
  long *local_80 [2];
  long local_70 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  local_60;
  
  pLVar13 = this->lightParams;
  if ((pLVar13->WaveVector).super_ParameterBase.empty_ == false) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_d8,&(pLVar13->WaveVector).data_);
    (this->k_).super_Vector<double,_3U>.data_[0] = *(double *)local_d8._0_8_;
    (this->k_).super_Vector<double,_3U>.data_[1] = *(double *)(local_d8._0_8_ + 8);
    (this->k_).super_Vector<double,_3U>.data_[2] = *(double *)(local_d8._0_8_ + 0x10);
    dVar19 = 0.0;
    lVar10 = 0;
    do {
      dVar20 = (this->k_).super_Vector<double,_3U>.data_[lVar10];
      dVar19 = dVar19 + dVar20 * dVar20;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    dVar20 = 0.0;
    this->kmag_ = dVar19;
    this->lambda_ = 6.283185307179586 / dVar19;
    this->omega_ = 18836.515673088536 / (6.283185307179586 / dVar19);
    dVar19 = (this->k_).super_Vector<double,_3U>.data_[1];
    (this->khat_).super_Vector<double,_3U>.data_[0] = (this->k_).super_Vector<double,_3U>.data_[0];
    (this->khat_).super_Vector<double,_3U>.data_[1] = dVar19;
    (this->khat_).super_Vector<double,_3U>.data_[2] = (this->k_).super_Vector<double,_3U>.data_[2];
    lVar10 = 0;
    do {
      dVar19 = (this->khat_).super_Vector<double,_3U>.data_[lVar10];
      dVar20 = dVar20 + dVar19 * dVar19;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (dVar20 < 0.0) {
      dVar20 = sqrt(dVar20);
    }
    else {
      dVar20 = SQRT(dVar20);
    }
    lVar10 = 0;
    do {
      (this->khat_).super_Vector<double,_3U>.data_[lVar10] =
           (this->khat_).super_Vector<double,_3U>.data_[lVar10] / dVar20;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if ((double *)local_d8._0_8_ != (double *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
    }
    pLVar13 = this->lightParams;
    bVar11 = 1;
  }
  else {
    bVar11 = 0;
  }
  bVar16 = bVar11;
  if ((pLVar13->PropagationDirection).super_ParameterBase.empty_ == false) {
    if (bVar11 != 0) {
      memcpy(&painCave,
             "light: please specify either waveVector or propagationDirection, but not both.\n",0x50
            );
      painCave.isFatal = 1;
      simError();
      pLVar13 = this->lightParams;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_d8,
               &(pLVar13->PropagationDirection).data_);
    (this->khat_).super_Vector<double,_3U>.data_[0] = *(double *)local_d8._0_8_;
    (this->khat_).super_Vector<double,_3U>.data_[1] = *(double *)(local_d8._0_8_ + 8);
    (this->khat_).super_Vector<double,_3U>.data_[2] = *(double *)(local_d8._0_8_ + 0x10);
    dVar19 = 0.0;
    lVar10 = 0;
    do {
      dVar20 = (this->khat_).super_Vector<double,_3U>.data_[lVar10];
      dVar19 = dVar19 + dVar20 * dVar20;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    lVar10 = 0;
    do {
      (this->khat_).super_Vector<double,_3U>.data_[lVar10] =
           (this->khat_).super_Vector<double,_3U>.data_[lVar10] / dVar19;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    if ((double *)local_d8._0_8_ != (double *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ - local_d8._0_8_);
    }
    pLVar13 = this->lightParams;
    bVar16 = 1;
  }
  if ((pLVar13->Wavelength).super_ParameterBase.empty_ == false) {
    if (bVar11 != 0) {
      memcpy(&painCave,
             "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
             ,0x5c);
      painCave.isFatal = 1;
      simError();
      pLVar13 = this->lightParams;
    }
    dVar19 = (pLVar13->Wavelength).data_ * 10.0;
    this->lambda_ = dVar19;
    this->omega_ = 18836.515673088536 / dVar19;
    this->kmag_ = 6.283185307179586 / dVar19;
    bVar11 = 1;
  }
  if ((pLVar13->Frequency).super_ParameterBase.empty_ == false) {
    if (bVar11 != 0) {
      memcpy(&painCave,
             "light: please specify one of: waveVector, wavelength, orfrequency (but only one of these).\n"
             ,0x5c);
      painCave.isFatal = 1;
      simError();
      pLVar13 = this->lightParams;
    }
    dVar19 = (pLVar13->Frequency).data_ * 1e-15;
    this->omega_ = dVar19;
    dVar19 = 18836.515673088536 / dVar19;
    this->lambda_ = dVar19;
    this->kmag_ = 6.283185307179586 / dVar19;
LAB_0023b519:
    uVar15 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (bVar16 != 0) {
      dVar19 = this->kmag_;
      local_d8._0_8_ = (double *)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._16_8_ = (pointer)0x0;
      lVar10 = 0;
      do {
        *(double *)(local_d8 + lVar10 * 8) =
             (this->khat_).super_Vector<double,_3U>.data_[lVar10] * dVar19;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3);
      (this->k_).super_Vector<double,_3U>.data_[2] = (double)local_d8._16_8_;
      (this->k_).super_Vector<double,_3U>.data_[0] = (double)local_d8._0_8_;
      (this->k_).super_Vector<double,_3U>.data_[1] = (double)local_d8._8_8_;
    }
  }
  else {
    if (bVar11 != 0) goto LAB_0023b519;
    uVar15 = 0;
  }
  bVar3 = (pLVar13->Intensity).super_ParameterBase.empty_;
  if (bVar3 == false) {
    dVar19 = (pLVar13->Intensity).data_ * 1.439326e-11;
    dVar19 = (dVar19 + dVar19) / 0.7184379357665581;
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
    this->E0_ = dVar19;
  }
  this_00 = &this->jones_;
  pcVar9 = (this->jones_).
           super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->jones_).
      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar9) {
    (this->jones_).super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pcVar9;
  }
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve(this_00,2);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pdVar2 = (pointer)(local_d8 + 0x10);
  local_d8._0_8_ = pdVar2;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"X","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar6 = lightX;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Y","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar6 = lightY;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"+","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar6 = lightPlus;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  local_d8._0_8_ = pdVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"-","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
                         *)&local_60,(key_type *)local_d8);
  *pmVar6 = lightMinus;
  if ((pointer)local_d8._0_8_ != pdVar2) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  pLVar13 = this->lightParams;
  if ((pLVar13->Polarization).super_ParameterBase.empty_ == false) {
    pcVar4 = (pLVar13->Polarization).data_._M_dataplus._M_p;
    local_d8._0_8_ = pdVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,pcVar4,pcVar4 + (pLVar13->Polarization).data_._M_string_length);
    local_90 = (double)CONCAT71(local_90._1_7_,bVar16);
    iVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
            ::find(&local_60,(key_type *)local_d8);
    bVar11 = (byte)uVar15;
    switch(iVar8._M_node[2]._M_color) {
    case _S_red:
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar9->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar9->_M_value + 8) = 0;
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar9[1]._M_value = 0;
      *(undefined8 *)(pcVar9[1]._M_value + 8) = 0;
      goto LAB_0023b975;
    case _S_black:
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar9->_M_value = 0;
      *(undefined8 *)(pcVar9->_M_value + 8) = 0;
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0x3ff00000;
      uVar18 = 0;
      break;
    case 2:
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar9->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar9->_M_value + 8) = 0;
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0;
      uVar18 = 0x3ff00000;
      break;
    case 3:
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)pcVar9->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar9->_M_value + 8) = 0;
      pcVar9 = (this_00->
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar17 = 0;
      uVar18 = 0xbff00000;
      break;
    default:
      builtin_strncpy(painCave.errMsg + 0x10,"olarization type\n",0x12);
      builtin_strncpy(painCave.errMsg,"Light: Unknown p",0x10);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      bVar12 = 0;
      goto LAB_0023b978;
    }
    *(undefined4 *)pcVar9[1]._M_value = 0;
    *(undefined4 *)(pcVar9[1]._M_value + 4) = uVar17;
    *(undefined4 *)(pcVar9[1]._M_value + 8) = 0;
    *(undefined4 *)(pcVar9[1]._M_value + 0xc) = uVar18;
LAB_0023b975:
    bVar12 = 1;
LAB_0023b978:
    if ((pointer)local_d8._0_8_ != pdVar2) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    bVar16 = local_90._0_1_;
    if ((byte)(bVar11 & local_90._0_1_ & bVar12 & (bVar3 ^ 1U)) == 1) {
      this->doLight = true;
      goto LAB_0023babe;
    }
  }
  else {
    local_d8._8_8_ = (pointer)0x0;
    local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_60._M_impl.super__Rb_tree_header) {
      uVar14 = 0xfffffffffffffffe;
      local_d8._0_8_ = pdVar2;
    }
    else {
      local_90 = (double)CONCAT71(local_90._1_7_,bVar16);
      lVar10 = 0;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      local_d8._0_8_ = pdVar2;
      local_84 = (uint)uVar15;
      do {
        local_80[0] = local_70;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_80,*(long *)(p_Var7 + 1),
                   (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
        std::__cxx11::string::append((char *)local_80);
        std::__cxx11::string::_M_append(local_d8,(ulong)local_80[0]);
        if (local_80[0] != local_70) {
          operator_delete(local_80[0],local_70[0] + 1);
        }
        lVar10 = (long)&(p_Var7[1]._M_parent)->_M_color + (long)(int)lVar10 + 2;
        if (0x31 < (int)lVar10) {
          std::__cxx11::string::append(local_d8);
          lVar10 = 0;
        }
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      } while ((_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header);
      uVar14 = local_d8._8_8_ - 2;
      uVar15 = (ulong)local_84;
      bVar16 = local_90._0_1_;
    }
    bVar11 = (byte)uVar15;
    std::__cxx11::string::erase((ulong)local_d8,uVar14);
    snprintf(painCave.errMsg,2000,
             "Light: No polarization was set in the omd file. This parameter\n\tmust be set to use Light, and can take any of these values:\n\t\t%s.\n"
            );
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
    }
    bVar12 = 0;
  }
  if (bVar16 == 0) {
    builtin_strncpy(painCave.errMsg,"Light: could not determine direction of propagation.\n",0x36);
    painCave.isFatal = 1;
    simError();
  }
  if (bVar3 != false) {
    builtin_strncpy(painCave.errMsg + 0x10," not specified.\n",0x11);
    builtin_strncpy(painCave.errMsg,"Light: intensity",0x10);
    painCave.isFatal = 1;
    simError();
  }
  if (bVar11 == 0) {
    builtin_strncpy(painCave.errMsg,"Light: could not determine frequency or wavelength.\n",0x35);
    painCave.isFatal = 1;
    simError();
  }
  if (bVar12 == 0) {
    builtin_strncpy(painCave.errMsg,"Light: polarization  not specifieid.\n",0x26);
    painCave.isFatal = 1;
    simError();
  }
LAB_0023babe:
  if ((this->info_->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  dVar19 = (this->khat_).super_Vector<double,_3U>.data_[2];
  uVar17 = SUB84(dVar19,0);
  uVar18 = (undefined4)((ulong)dVar19 >> 0x20);
  if (dVar19 <= -1.0) {
    uVar17 = 0;
    uVar18 = 0xbff00000;
  }
  if (1.0 <= (double)CONCAT44(uVar18,uVar17)) {
    uVar17 = 0;
    uVar18 = 0x3ff00000;
  }
  local_90 = acos((double)CONCAT44(uVar18,uVar17));
  dVar19 = atan2(-(this->khat_).super_Vector<double,_3U>.data_[1],
                 (this->khat_).super_Vector<double,_3U>.data_[0]);
  SquareMatrix3<double>::setupRotMat
            (&this->A_,
             (double)(~-(ulong)(dVar19 < 0.0) & (ulong)dVar19 |
                     (ulong)(dVar19 + 6.283185307179586) & -(ulong)(dVar19 < 0.0)),local_90,0.0);
  SquareMatrix3<double>::inverse((SquareMatrix3<double> *)local_d8,&this->A_);
  if (&this->Ainv_ != (SquareMatrix3<double> *)local_d8) {
    lVar10 = 0;
    do {
      *(undefined8 *)
       ((long)(this->Ainv_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
       + lVar10 + 0x10) = *(undefined8 *)(local_d8 + lVar10 + 0x10);
      uVar5 = *(undefined8 *)(local_d8 + lVar10 + 8);
      puVar1 = (undefined8 *)
               ((long)(this->Ainv_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar10);
      *puVar1 = *(undefined8 *)(local_d8 + lVar10);
      puVar1[1] = uVar5;
      lVar10 = lVar10 + 0x18;
    } while (lVar10 != 0x48);
  }
  this->initialized = true;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Perturbations::Light::LightPolarization>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Light::initialize() {
    bool haveE0           = false;
    bool haveDirection    = false;
    bool haveFrequency    = false;
    bool havePolarization = false;

    if (lightParams->haveWaveVector()) {
      std::vector<RealType> k = lightParams->getWaveVector();
      // wave vectors are input in inverse angstroms, so no unit conversion:
      k_.x()        = k[0];
      k_.y()        = k[1];
      k_.z()        = k[2];
      kmag_         = k_.length();
      lambda_       = 2.0 * Constants::PI / kmag_;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      haveFrequency = true;
      khat_         = k_;
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->havePropagationDirection()) {
      if (haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify either waveVector or "
                 "propagationDirection, but not both.\n");
        painCave.isFatal = 1;
        simError();
      }
      std::vector<RealType> pd = lightParams->getPropagationDirection();
      khat_.x()                = pd[0];
      khat_.y()                = pd[1];
      khat_.z()                = pd[2];
      khat_.normalize();
      haveDirection = true;
    }

    if (lightParams->haveWavelength()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // wavelengths are entered in nm to work with experimentalists.
      // Convert to angstroms:
      lambda_       = lightParams->getWavelength() * 10.0;
      omega_        = 2.0 * Constants::PI * Constants::c / lambda_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (lightParams->haveFrequency()) {
      if (haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "light: please specify one of: waveVector, wavelength, or"
                 "frequency (but only one of these).\n");
        painCave.isFatal = 1;
        simError();
      }
      // frequencies are entered in Hz to work with experimentalists.
      // Convert to fs^-1
      omega_        = lightParams->getFrequency() * 1.0e-15;
      lambda_       = 2.0 * Constants::PI * Constants::c / omega_;
      kmag_         = 2.0 * Constants::PI / lambda_;
      haveFrequency = true;
    }

    if (haveFrequency && haveDirection) { k_ = khat_ * kmag_; }

    if (lightParams->haveIntensity()) {
      RealType intense = lightParams->getIntensity();
      // intensities are input in W/cm^2
      intense *= 1.439326e-11;
      E0_ = std::sqrt(2.0 * intense / (Constants::epsilon0 * Constants::c));
      // E0 now has units of kcal/mol e^-1 Angstroms^-1
      haveE0 = true;
    }

    // Determine Polarization Type
    jones_.clear();
    jones_.reserve(2);
    std::map<std::string, LightPolarization> stringToPolarization;

    stringToPolarization["X"] = lightX;
    stringToPolarization["Y"] = lightY;
    stringToPolarization["+"] = lightPlus;
    stringToPolarization["-"] = lightMinus;

    if (lightParams->havePolarization()) {
      std::string lpl      = lightParams->getPolarization();
      LightPolarization lp = stringToPolarization.find(lpl)->second;
      switch (lp) {
      case lightX:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 0.0};
        havePolarization = true;
        break;
      case lightY:
        jones_[0]        = {0.0, 0.0};
        jones_[1]        = {1.0, 0.0};
        havePolarization = true;
        break;
      case lightPlus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, 1.0};
        havePolarization = true;
        break;
      case lightMinus:
        jones_[0]        = {1.0, 0.0};
        jones_[1]        = {0.0, -1.0};
        havePolarization = true;
        break;
      default:
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: Unknown polarization type\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
        break;
      }

    } else {
      std::string allowedPolarizations;
      int currentLineLength = 0;

      for (std::map<std::string, LightPolarization>::iterator polStrIter =
               stringToPolarization.begin();
           polStrIter != stringToPolarization.end(); ++polStrIter) {
        allowedPolarizations += polStrIter->first + ", ";
        currentLineLength += polStrIter->first.length() + 2;

        if (currentLineLength >= 50) {
          allowedPolarizations += "\n\t\t";
          currentLineLength = 0;
        }
      }

      allowedPolarizations.erase(allowedPolarizations.length() - 2, 2);

      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "Light: No polarization was set in the omd file. This parameter\n"
          "\tmust be set to use Light, and can take any of these values:\n"
          "\t\t%s.\n",
          allowedPolarizations.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (haveE0 && haveDirection && haveFrequency && havePolarization) {
      doLight = true;
    } else {
      if (!haveDirection) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine direction of propagation.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveE0) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: intensity not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveFrequency) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: could not determine frequency or wavelength.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!havePolarization) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Light: polarization  not specifieid.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;

    // Relatively simple Euler angles between khat_ and lab frame:

    RealType psi = 0.0;
    RealType theta =
        acos(std::min((RealType)1.0, std::max((RealType)-1.0, khat_[2])));
    RealType phi = std::atan2(-khat_[1], khat_[0]);

    if (phi < 0) phi += 2.0 * Constants::PI;

    A_.setupRotMat(phi, theta, psi);
    Ainv_ = A_.inverse();

    initialized = true;
  }